

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WhiteRoomOneAction.cpp
# Opt level: O0

ActionResults * __thiscall WhiteRoomOneAction::Pick(WhiteRoomOneAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *pIVar3;
  ActionResults *this_00;
  bool bVar4;
  allocator local_41;
  string local_40 [32];
  itemType local_20 [2];
  WhiteRoomOneAction *local_18;
  WhiteRoomOneAction *this_local;
  
  local_18 = this;
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  bVar4 = false;
  if (iVar1 == DISCUS) {
    local_20[1] = 0x29;
    pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,local_20 + 1);
    iVar2 = ItemWrapper::getLocation(pIVar3);
    bVar4 = iVar2 != BACKPACK;
  }
  if (bVar4) {
    local_20[0] = DISCUS;
    pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,local_20);
    ItemWrapper::setLocation(pIVar3,BACKPACK);
    this_00 = (ActionResults *)operator_new(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"You pick up the shiny discus.",&local_41);
    ActionResults::ActionResults(this_00,CURRENT,(string *)local_40);
    this_local = (WhiteRoomOneAction *)this_00;
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    this_local = (WhiteRoomOneAction *)AbstractRoomAction::Pick(&this->super_AbstractRoomAction);
  }
  return (ActionResults *)this_local;
}

Assistant:

ActionResults *WhiteRoomOneAction::Pick() {
    if(commands->getMainItem() == DISCUS && itemList->getValue(DISCUS)->getLocation() != BACKPACK){
        itemList->getValue(DISCUS)->setLocation(BACKPACK);
        return new ActionResults(CURRENT, "You pick up the shiny discus.");
    }
    else {
        return AbstractRoomAction::Pick();
    }
}